

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O2

QByteArray * __thiscall
QNetworkHeadersPrivate::rawHeader
          (QByteArray *__return_storage_ptr__,QNetworkHeadersPrivate *this,QAnyStringView headerName
          )

{
  int iVar1;
  qsizetype qVar2;
  char *s;
  QHttpHeaders *this_00;
  qsizetype i;
  long i_00;
  QByteArrayView QVar3;
  QLatin1StringView QVar4;
  QAnyStringView QVar5;
  QAnyStringView QVar6;
  
  QVar3 = QHttpHeaders::wellKnownHeaderName(SetCookie);
  QVar5.field_0 = (anon_union_8_3_8ad491a7_for_QAnyStringView_6)QVar3.m_data;
  QVar5.m_size = QVar3.m_size;
  iVar1 = QAnyStringView::compare(headerName,QVar5,CaseInsensitive);
  if (iVar1 == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
    this_00 = &this->httpHeaders;
    s = "";
    i_00 = 0;
    while( true ) {
      qVar2 = QHttpHeaders::size(this_00);
      if (qVar2 <= i_00) break;
      QVar4 = QHttpHeaders::nameAt(this_00,i_00);
      QVar6.m_size = QVar4.m_size | 0x4000000000000000;
      QVar6.field_0.m_data_utf8 = QVar4.m_data;
      iVar1 = QAnyStringView::compare(QVar6,headerName,CaseInsensitive);
      if (iVar1 == 0) {
        QByteArray::append(__return_storage_ptr__,s);
        QVar3 = QHttpHeaders::valueAt(this_00,i_00);
        QByteArray::append(__return_storage_ptr__,QVar3);
        s = "\n";
      }
      i_00 = i_00 + 1;
    }
  }
  else {
    QHttpHeaders::combinedValue(__return_storage_ptr__,&this->httpHeaders,headerName);
  }
  return __return_storage_ptr__;
}

Assistant:

QByteArray QNetworkHeadersPrivate::rawHeader(QAnyStringView headerName) const
{
    QByteArrayView setCookieStr = QHttpHeaders::wellKnownHeaderName(
            QHttpHeaders::WellKnownHeader::SetCookie);
    if (QAnyStringView::compare(headerName, setCookieStr, Qt::CaseInsensitive) != 0)
        return httpHeaders.combinedValue(headerName);

    QByteArray result;
    const char* separator = "";
    for (qsizetype i = 0; i < httpHeaders.size(); ++i) {
        if (QAnyStringView::compare(httpHeaders.nameAt(i), headerName, Qt::CaseInsensitive) == 0) {
            result.append(separator);
            result.append(httpHeaders.valueAt(i));
            separator = "\n";
        }
    }
    return result;
}